

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

void __thiscall Js::PathTypeHandlerBase::LockInlineSlotCapacity(PathTypeHandlerBase *this)

{
  PathTypeSuccessorInfo *pPVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  
  if (((this->super_DynamicTypeHandler).propertyTypes & 0x40) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x9ef,"(!GetIsInlineSlotCapacityLocked())",
                                "!GetIsInlineSlotCapacityLocked()");
    if (!bVar3) goto LAB_00dc16e9;
    *puVar5 = 0;
  }
  DynamicTypeHandler::SetIsInlineSlotCapacityLocked(&this->super_DynamicTypeHandler);
  pPVar1 = (this->successorInfo).ptr;
  if (pPVar1 != (PathTypeSuccessorInfo *)0x0) {
    if (pPVar1->kind == PathTypeSuccessorKindSingle) {
      if ((*(long **)(pPVar1 + 0x10) != (long *)0x0) &&
         (lVar7 = **(long **)(pPVar1 + 0x10), lVar7 != 0)) {
        (**(code **)(**(long **)(lVar7 + 0x28) + 0x1f0))();
        return;
      }
    }
    else {
      lVar7 = *(long *)(pPVar1 + 8);
      if (lVar7 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0xdf,"(this->propertySuccessors)","this->propertySuccessors");
        if (!bVar3) {
LAB_00dc16e9:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
        lVar7 = *(long *)(pPVar1 + 8);
      }
      uVar4 = *(uint *)(lVar7 + 0x24);
      if (uVar4 != 0) {
        uVar8 = 0;
        do {
          iVar9 = *(int *)(*(long *)(lVar7 + 8) + uVar8 * 4);
          if (iVar9 != -1) {
            do {
              lVar6 = (long)iVar9;
              iVar9 = *(int *)(*(long *)(lVar7 + 0x10) + 8 + lVar6 * 0x18);
              lVar6 = **(long **)(*(long *)(lVar7 + 0x10) + lVar6 * 0x18);
              if (lVar6 != 0) {
                (**(code **)(**(long **)(lVar6 + 0x28) + 0x1f0))();
              }
            } while (iVar9 != -1);
            uVar4 = *(uint *)(lVar7 + 0x24);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < uVar4);
      }
    }
  }
  return;
}

Assistant:

void PathTypeHandlerBase::LockInlineSlotCapacity()
    {
        Assert(!GetIsInlineSlotCapacityLocked());
        SetIsInlineSlotCapacityLocked();

        this->MapSuccessors([](const PathTypeSuccessorKey, RecyclerWeakReference<DynamicType>* typeWeakReference)
        {
            DynamicType * type = typeWeakReference->Get();
            if (!type)
            {
                return;
            }

            type->GetTypeHandler()->LockInlineSlotCapacity();
        });
    }